

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O2

void duckdb::ExtractSingleTuple
               (string_t *string,RE2 *pattern,int32_t group,RegexStringPieceArgs *args,
               Vector *result,idx_t row)

{
  data_ptr_t pdVar1;
  undefined4 *__src;
  Vector *vec;
  RegexStringPieceArgs *pRVar2;
  bool bVar3;
  Vector *vector;
  idx_t row_idx;
  long *plVar4;
  InvalidInputException *this;
  long lVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  uint uVar8;
  ulong size;
  allocator local_c1;
  Vector *local_c0;
  RegexStringPieceArgs *local_b8;
  int32_t local_ac;
  string local_a8;
  idx_t local_88;
  long local_80;
  idx_t startpos;
  long *local_70;
  TemplatedValidityMask<unsigned_long> *local_68;
  idx_t local_60;
  ulong local_58;
  long local_50;
  RE2 *local_48;
  StringPiece input;
  
  input.size_ = (size_type)(string->value).pointer.length;
  if (input.size_ < 0xd) {
    input.data_ = (string->value).pointer.prefix;
  }
  else {
    input.data_ = (string->value).pointer.ptr;
  }
  local_c0 = result;
  local_b8 = args;
  local_48 = pattern;
  vector = ListVector::GetEntry(result);
  pdVar6 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  row_idx = ListVector::GetListSize(result);
  local_88 = ListVector::GetListCapacity(result);
  local_70 = (long *)(result->data + row * 0x10);
  *(idx_t *)(result->data + row * 0x10) = row_idx;
  if (group < 0) {
    local_70[1] = 0;
  }
  else {
    local_68 = &(vector->validity).super_TemplatedValidityMask<unsigned_long>;
    local_58 = (ulong)(uint)group;
    local_60 = local_b8->size;
    startpos = 0;
    uVar7 = row_idx << 4 | 4;
    local_80 = 0;
    local_50 = local_58 << 4;
    local_ac = group;
    do {
      pRVar2 = local_b8;
      bVar3 = ExtractAll(&input,local_48,&startpos,local_b8->group_buffer,(int)local_b8->size);
      vec = local_c0;
      size = row_idx;
      if (!bVar3) break;
      lVar5 = local_80 + -1;
      if ((local_80 == 0) && (local_60 < local_58)) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a8,"Pattern has %d groups. Cannot access group %d",&local_c1);
        InvalidInputException::InvalidInputException<unsigned_long,int>
                  (this,&local_a8,local_b8->size,local_ac);
        __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      size = row_idx + 1;
      local_80 = lVar5;
      if (local_88 <= size) {
        ListVector::Reserve(local_c0,local_88 * 2);
        local_88 = ListVector::GetListCapacity(vec);
        pdVar6 = vector->data;
      }
      lVar5 = *(long *)((long)&pRVar2->group_buffer->size_ + local_50);
      plVar4 = (long *)((long)&pRVar2->group_buffer->data_ + local_50);
      if (lVar5 == 0) {
        local_a8._M_string_length._0_4_ = 0;
        local_a8._M_dataplus._M_p._0_4_ = 0;
        local_a8._M_dataplus._M_p._4_4_ = 0;
        pdVar1 = pdVar6 + (uVar7 - 4);
        pdVar1[0] = '\0';
        pdVar1[1] = '\0';
        pdVar1[2] = '\0';
        pdVar1[3] = '\0';
        pdVar1 = pdVar6 + uVar7;
        pdVar1[0] = '\0';
        pdVar1[1] = '\0';
        pdVar1[2] = '\0';
        pdVar1[3] = '\0';
        pdVar1[4] = '\0';
        pdVar1[5] = '\0';
        pdVar1[6] = '\0';
        pdVar1[7] = '\0';
        pdVar1 = pdVar6 + uVar7 + 8;
        pdVar1[0] = '\0';
        pdVar1[1] = '\0';
        pdVar1[2] = '\0';
        pdVar1[3] = '\0';
        if (*plVar4 == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid(local_68,row_idx);
        }
      }
      else {
        __src = (undefined4 *)*plVar4;
        uVar8 = (uint)lVar5;
        if (uVar8 < 0xd) {
          local_a8._M_string_length._0_4_ = 0;
          local_a8._M_dataplus._M_p._0_4_ = 0;
          local_a8._M_dataplus._M_p._4_4_ = 0;
          if (uVar8 != 0) {
            switchD_00917c1c::default(&local_a8,__src,(ulong)(uVar8 & 0xf));
          }
        }
        else {
          local_a8._M_dataplus._M_p._0_4_ = *__src;
          local_a8._M_dataplus._M_p._4_4_ = SUB84(__src,0);
          local_a8._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
        }
        *(uint *)(pdVar6 + (uVar7 - 4)) = uVar8;
        *(ulong *)(pdVar6 + uVar7) =
             CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_);
        *(undefined4 *)(pdVar6 + uVar7 + 8) = (undefined4)local_a8._M_string_length;
      }
      uVar7 = uVar7 + 0x10;
      row_idx = size;
    } while (startpos <= input.size_);
    local_70[1] = size - *local_70;
    ListVector::SetListSize(local_c0,size);
  }
  return;
}

Assistant:

void ExtractSingleTuple(const string_t &string, duckdb_re2::RE2 &pattern, int32_t group, RegexStringPieceArgs &args,
                        Vector &result, idx_t row) {
	auto input = CreateStringPiece(string);

	auto &child_vector = ListVector::GetEntry(result);
	auto list_content = FlatVector::GetData<string_t>(child_vector);
	auto &child_validity = FlatVector::Validity(child_vector);

	auto current_list_size = ListVector::GetListSize(result);
	auto current_list_capacity = ListVector::GetListCapacity(result);

	auto result_data = FlatVector::GetData<list_entry_t>(result);
	auto &list_entry = result_data[row];
	list_entry.offset = current_list_size;

	if (group < 0) {
		list_entry.length = 0;
		return;
	}
	// If the requested group index is out of bounds
	// we want to throw only if there is a match
	bool throw_on_group_found = (idx_t)group > args.size;

	idx_t startpos = 0;
	for (idx_t iteration = 0;
	     ExtractAll(input, pattern, &startpos, args.group_buffer, UnsafeNumericCast<int>(args.size)); iteration++) {
		if (!iteration && throw_on_group_found) {
			throw InvalidInputException("Pattern has %d groups. Cannot access group %d", args.size, group);
		}

		// Make sure we have enough room for the new entries
		if (current_list_size + 1 >= current_list_capacity) {
			ListVector::Reserve(result, current_list_capacity * 2);
			current_list_capacity = ListVector::GetListCapacity(result);
			list_content = FlatVector::GetData<string_t>(child_vector);
		}

		// Write the captured groups into the list-child vector
		auto &match_group = args.group_buffer[group];

		idx_t child_idx = current_list_size;
		if (match_group.empty()) {
			// This group was not matched
			list_content[child_idx] = string_t(string.GetData(), 0);
			if (match_group.begin() == nullptr) {
				// This group is optional
				child_validity.SetInvalid(child_idx);
			}
		} else {
			// Every group is a substring of the original, we can find out the offset using the pointer
			// the 'match_group' address is guaranteed to be bigger than that of the source
			D_ASSERT(const_char_ptr_cast(match_group.begin()) >= string.GetData());
			auto offset = UnsafeNumericCast<idx_t>(match_group.begin() - string.GetData());
			list_content[child_idx] =
			    string_t(string.GetData() + offset, UnsafeNumericCast<uint32_t>(match_group.size()));
		}
		current_list_size++;
		if (startpos > input.size()) {
			// Empty match found at the end of the string
			break;
		}
	}
	list_entry.length = current_list_size - list_entry.offset;
	ListVector::SetListSize(result, current_list_size);
}